

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int float64_is_signaling_nan_riscv64(float64 a_,float_status *status)

{
  uint64_t a;
  
  return (int)((a_ & 0x7ffffffffffff) != 0 && (a_ & 0x7ff8000000000000) == 0x7ff0000000000000);
}

Assistant:

int float64_is_signaling_nan(float64 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    uint64_t a = float64_val(a_);
    if (snan_bit_is_one(status)) {
        return ((a << 1) >= 0xFFF0000000000000ULL);
    } else {
        return (((a >> 51) & 0xFFF) == 0xFFE)
            && (a & UINT64_C(0x0007FFFFFFFFFFFF));
    }
#endif
}